

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _Alloc_hider _Var2;
  int iVar3;
  long *plVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  Pattern PVar8;
  undefined8 uVar9;
  bool bVar10;
  string token;
  value_type local_b8;
  undefined1 local_a8 [16];
  NamePattern *local_98;
  _Alloc_hider _Stack_90;
  NamePattern local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&this->m_arg);
  puVar5 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar5) {
    uVar7 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_98,(ulong)&local_50);
      std::__cxx11::string::substr((ulong)&local_88.m_wildcardPattern.m_pattern,(ulong)&local_50);
      PVar8._vptr_Pattern = (_func_int **)0xf;
      if (local_98 != &local_88) {
        PVar8._vptr_Pattern = local_88.super_Pattern._vptr_Pattern;
      }
      if (PVar8._vptr_Pattern <
          _Stack_90._M_p + local_88.m_wildcardPattern.m_pattern._M_string_length) {
        uVar9 = (_func_int **)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.m_wildcardPattern.m_pattern._M_dataplus._M_p !=
            &local_88.m_wildcardPattern.m_pattern.field_2) {
          uVar9 = local_88.m_wildcardPattern.m_pattern.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < _Stack_90._M_p + local_88.m_wildcardPattern.m_pattern._M_string_length)
        goto LAB_001365dc;
        plVar4 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_88.m_wildcardPattern.m_pattern,0,(char *)0x0,
                                    (ulong)local_98);
      }
      else {
LAB_001365dc:
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_98,
                                    (ulong)local_88.m_wildcardPattern.m_pattern._M_dataplus._M_p);
      }
      peVar1 = (element_type *)(plVar4 + 2);
      if ((element_type *)*plVar4 == peVar1) {
        local_a8._0_8_ = peVar1->_vptr_Pattern;
        local_a8._8_8_ = plVar4[3];
        local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_a8;
      }
      else {
        local_a8._0_8_ = peVar1->_vptr_Pattern;
        local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar4;
      }
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
      *plVar4 = (long)peVar1;
      plVar4[1] = 0;
      *(undefined1 *)&peVar1->_vptr_Pattern = 0;
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b8);
      if (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)local_a8) {
        operator_delete(local_b8.
                        super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.m_wildcardPattern.m_pattern._M_dataplus._M_p !=
          &local_88.m_wildcardPattern.m_pattern.field_2) {
        operator_delete(local_88.m_wildcardPattern.m_pattern._M_dataplus._M_p);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98);
      }
      uVar7 = uVar7 + 1;
      puVar5 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)puVar6 - (long)puVar5 >> 3));
  }
  if (puVar6 != puVar5) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"exclude:","");
  if (local_50._M_string_length <
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi) {
    bVar10 = false;
  }
  else if (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar10 = true;
  }
  else {
    iVar3 = bcmp(local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,local_50._M_dataplus._M_p,
                 (size_t)local_b8.
                         super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    bVar10 = iVar3 == 0;
  }
  if ((NamePattern *)
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (NamePattern *)local_a8) {
    operator_delete(local_b8.
                    super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
  }
  if (bVar10) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_50);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b8);
    if ((NamePattern *)
        local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (NamePattern *)local_a8) {
      operator_delete(local_b8.
                      super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_98 = (NamePattern *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Catch::TestSpec::NamePattern,std::allocator<Catch::TestSpec::NamePattern>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_90,&local_98,
               (_Sp_alloc_shared_tag<std::allocator<Catch::TestSpec::NamePattern>_>)
               &local_88.m_wildcardPattern.m_pattern,&local_50);
    local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_98->super_Pattern;
    local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_p;
    if (this->m_exclusion == true) {
      local_98 = (NamePattern *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Catch::TestSpec::ExcludedPattern,std::allocator<Catch::TestSpec::ExcludedPattern>,std::shared_ptr<Catch::TestSpec::Pattern>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&_Stack_90,
                 (ExcludedPattern **)&local_98,
                 (_Sp_alloc_shared_tag<std::allocator<Catch::TestSpec::ExcludedPattern>_>)
                 &local_88.m_wildcardPattern.m_pattern,&local_b8);
      _Var2._M_p = _Stack_90._M_p;
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_98->super_Pattern;
      this_00._M_pi =
           local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      local_98 = (NamePattern *)0x0;
      _Stack_90._M_p = (pointer)0x0;
      local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var2._M_p;
      if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_90._M_p);
      }
    }
    clara::std::
    vector<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,&local_b8);
    if (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( std::size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                TestSpec::PatternPtr pattern = std::make_shared<T>( token );
                if( m_exclusion )
                    pattern = std::make_shared<TestSpec::ExcludedPattern>( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }